

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcFlowStorageDeviceType::IfcFlowStorageDeviceType
          (IfcFlowStorageDeviceType *this,void **vtt)

{
  void *pvVar1;
  
  IfcDistributionFlowElementType::IfcDistributionFlowElementType
            (&this->super_IfcDistributionFlowElementType,vtt + 1);
  pvVar1 = vtt[0x32];
  *(void **)&(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
             field_0x1a0 = pvVar1;
  *(void **)(&(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
              field_0x1a0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0x33];
  pvVar1 = *vtt;
  *(void **)&(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
             super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject = pvVar1;
  *(void **)(&(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
              super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x0 +
            *(long *)((long)pvVar1 + -0x18)) = vtt[0x34];
  *(void **)&(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
             super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x88 = vtt[0x35];
  (this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.super_IfcElementType
  .super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x36];
  *(void **)&(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
             super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0xf0 = vtt[0x37];
  *(void **)&(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
             super_IfcElementType.super_IfcTypeProduct.field_0x148 = vtt[0x38];
  *(void **)&(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
             super_IfcElementType.field_0x180 = vtt[0x39];
  *(void **)&(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
             super_IfcElementType.field_0x190 = vtt[0x3a];
  *(void **)&(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
             field_0x1a0 = vtt[0x3b];
  return;
}

Assistant:

IfcFlowStorageDeviceType() : Object("IfcFlowStorageDeviceType") {}